

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learning.h
# Opt level: O0

double __thiscall
klogic::learning::
teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
::mse<SingleSquareError>
          (teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
           *this,SingleSquareError *sq_err)

{
  mlmvn *this_00;
  const_iterator cVar1;
  bool bVar2;
  int iVar3;
  pointer X;
  reference sample;
  double dVar4;
  undefined1 local_50 [8];
  desired_type actual;
  __normal_iterator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_*,_std::vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>_>
  local_30;
  __normal_iterator<const_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_*,_std::vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>_>
  local_28;
  const_iterator i;
  double acc_error;
  SingleSquareError *sq_err_local;
  teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  *this_local;
  
  i._M_current = (sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                  *)0x0;
  local_30._M_current =
       (sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> *)
       std::
       vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
       ::begin(&this->_samples);
  __gnu_cxx::
  __normal_iterator<klogic::learning::sample<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>const*,std::vector<klogic::learning::sample<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,std::allocator<klogic::learning::sample<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>>>>
  ::
  __normal_iterator<klogic::learning::sample<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>*>
            ((__normal_iterator<klogic::learning::sample<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>const*,std::vector<klogic::learning::sample<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,std::allocator<klogic::learning::sample<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>>>>
              *)&local_28,&local_30);
  while( true ) {
    actual.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
                  ::end(&this->_samples);
    bVar2 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_*,_std::vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>_>
                        *)&actual.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cVar1 = i;
    if (!bVar2) break;
    this_00 = this->learner;
    X = __gnu_cxx::
        __normal_iterator<const_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_*,_std::vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>_>
        ::operator->(&local_28);
    mlmvn::output((cvector *)local_50,this_00,&X->input);
    sample = __gnu_cxx::
             __normal_iterator<const_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_*,_std::vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>_>
             ::operator*(&local_28);
    dVar4 = SingleSquareError::operator()(sq_err,sample,(cvector *)local_50);
    i._M_current = (sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                    *)(dVar4 + i._M_current);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_50);
    __gnu_cxx::
    __normal_iterator<const_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_*,_std::vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>_>
    ::operator++(&local_28);
  }
  iVar3 = samples_count(this);
  return (double)cVar1._M_current / (double)iVar3;
}

Assistant:

double mse(SquareError const &sq_err = SquareError()) {
                double acc_error = 0.0;

                for (typename std::vector<Sample>::const_iterator i = _samples.begin();
                        i != _samples.end(); ++i) {

                    typename Sample::desired_type actual = learner.output(i->input);

                    acc_error += sq_err(*i, actual);
                }

                return acc_error / samples_count();
            }